

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

void __thiscall FIX::FieldMap::setField(FieldMap *this,FieldBase *field,bool overwrite)

{
  bool bVar1;
  int tag;
  pointer this_00;
  string *string;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_30;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_28;
  iterator i;
  bool overwrite_local;
  FieldBase *field_local;
  FieldMap *this_local;
  
  i._M_current._7_1_ = overwrite;
  if (overwrite) {
    tag = FieldBase::getTag(field);
    local_28._M_current = (FieldBase *)findTag(this,tag);
    local_30._M_current =
         (FieldBase *)
         std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
    bVar1 = __gnu_cxx::operator==(&local_28,&local_30);
    if (bVar1) {
      addField(this,field);
    }
    else {
      this_00 = __gnu_cxx::
                __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
                ::operator->(&local_28);
      string = FieldBase::getString_abi_cxx11_(field);
      FieldBase::setString(this_00,string);
    }
  }
  else {
    addField(this,field);
  }
  return;
}

Assistant:

void setField( const FieldBase& field, bool overwrite = true )
  EXCEPT ( RepeatedTag )
  {
    if( !overwrite )
    {
      addField( field );
    }
    else
    {
      Fields::iterator i = findTag( field.getTag() );
      if( i == m_fields.end() )
      {
        addField( field );
      }
      else
      {
        i->setString( field.getString() );
      }
    }
  }